

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::IntegerStateQueryVerifiers::GetBooleanVerifier::verifyIntegerAnyOf
          (GetBooleanVerifier *this,TestContext *testCtx,GLenum name,GLint *references,
          size_t referencesLength)

{
  int *piVar1;
  ostringstream *this_00;
  char *pcVar2;
  bool bVar3;
  size_t sVar4;
  StateQueryMemoryWriteGuard<unsigned_char> state;
  undefined1 local_198 [384];
  
  state.m_preguard = 0xde;
  state.m_value = 0xde;
  state.m_postguard = 0xde;
  glu::CallLogWrapper::glGetBooleanv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,&state.m_value);
  bVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::verifyValidity
                    (&state,testCtx);
  if (bVar3) {
    sVar4 = 0;
    do {
      if (referencesLength == sVar4) {
        local_198._0_8_ = testCtx->m_log;
        this_00 = (ostringstream *)(local_198 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,"// ERROR: got ");
        pcVar2 = "mapped_ == GL_FALSE";
        if (state.m_value == '\x01') {
          pcVar2 = "mapped_ == GL_TRUE";
        }
        std::operator<<((ostream *)this_00,pcVar2 + 0xb);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        if (testCtx->m_testResult != QP_TEST_RESULT_PASS) {
          return;
        }
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid boolean value");
        return;
      }
      piVar1 = references + sVar4;
      sVar4 = sVar4 + 1;
    } while ((bool)state.m_value != (*piVar1 != 0));
  }
  return;
}

Assistant:

void GetBooleanVerifier::verifyIntegerAnyOf (tcu::TestContext& testCtx, GLenum name, const GLint references[], size_t referencesLength)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLboolean> state;
	glGetBooleanv(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	for (size_t ndx = 0; ndx < referencesLength; ++ndx)
	{
		const GLboolean expectedGLState = references[ndx] ? GL_TRUE : GL_FALSE;

		if (state == expectedGLState)
			return;
	}

	testCtx.getLog() << TestLog::Message << "// ERROR: got " << (state==GL_TRUE ? "GL_TRUE" : "GL_FALSE") << TestLog::EndMessage;
	if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
		testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
}